

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::DoubleRange::DoubleRange(DoubleRange *this,DoubleRange *from)

{
  ulong uVar1;
  double dVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__DoubleRange_004b0050;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  dVar2 = from->maxvalue_;
  this->minvalue_ = from->minvalue_;
  this->maxvalue_ = dVar2;
  return;
}

Assistant:

DoubleRange::DoubleRange(const DoubleRange& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&minvalue_, &from.minvalue_,
    static_cast<size_t>(reinterpret_cast<char*>(&maxvalue_) -
    reinterpret_cast<char*>(&minvalue_)) + sizeof(maxvalue_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.DoubleRange)
}